

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O0

civil_lookup * __thiscall
absl::lts_20240722::time_internal::cctz::TimeZoneInfo::MakeTime
          (civil_lookup *__return_storage_ptr__,TimeZoneInfo *this,civil_second *cs)

{
  long lVar1;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> lhs;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  diff_t dVar7;
  year_t yVar8;
  int_least64_t n;
  civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> a;
  time_point<seconds> local_118;
  const_reference local_110;
  TransitionType *tt_1;
  year_t local_f8;
  year_t shift;
  int_least64_t local_e8;
  fields local_e0;
  int_least64_t local_d0;
  undefined8 local_c8;
  time_point<seconds> local_c0;
  const_reference local_b8;
  TransitionType *tt;
  undefined8 local_a8;
  Transition target;
  size_t hint;
  Transition *end;
  Transition *begin;
  Transition *tr;
  size_t timecnt;
  civil_second *cs_local;
  TimeZoneInfo *this_local;
  memory_order __b;
  memory_order __b_1;
  
  sVar3 = std::
          vector<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
          ::size(&this->transitions_);
  if (sVar3 == 0) {
    __assert_fail("timecnt != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/absl-src/absl/time/internal/cctz/src/time_zone_info.cc"
                  ,0x39f,
                  "virtual time_zone::civil_lookup absl::time_internal::cctz::TimeZoneInfo::MakeTime(const civil_second &) const"
                 );
  }
  begin = (Transition *)0x0;
  pvVar4 = std::
           vector<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
           ::operator[](&this->transitions_,0);
  pvVar5 = pvVar4 + sVar3;
  bVar2 = detail::operator<(cs,&pvVar4->civil_sec);
  pvVar6 = pvVar4;
  if (!bVar2) {
    pvVar6 = std::
             vector<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
             ::operator[](&this->transitions_,sVar3 - 1);
    bVar2 = detail::operator>=(cs,&pvVar6->civil_sec);
    pvVar6 = pvVar5;
    if (!bVar2) {
      std::operator&(memory_order_relaxed,__memory_order_mask);
      target.prev_civil_sec.f_._8_8_ =
           (this->time_local_hint_).super___atomic_base<unsigned_long>._M_i;
      if ((target.prev_civil_sec.f_._8_8_ != 0) && ((ulong)target.prev_civil_sec.f_._8_8_ < sVar3))
      {
        pvVar6 = std::
                 vector<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
                 ::operator[](&this->transitions_,target.prev_civil_sec.f_._8_8_ - 1);
        bVar2 = detail::operator<=(&pvVar6->civil_sec,cs);
        if (bVar2) {
          pvVar6 = std::
                   vector<absl::lts_20240722::time_internal::cctz::Transition,_std::allocator<absl::lts_20240722::time_internal::cctz::Transition>_>
                   ::operator[](&this->transitions_,target.prev_civil_sec.f_._8_8_);
          bVar2 = detail::operator<(cs,&pvVar6->civil_sec);
          if (bVar2) {
            begin = pvVar4 + target.prev_civil_sec.f_._8_8_;
          }
        }
      }
      pvVar6 = begin;
      if (begin == (Transition *)0x0) {
        local_a8 = 0;
        target.unix_time._0_1_ = 0;
        target._8_8_ = (cs->f_).y;
        target.civil_sec.f_.y._0_1_ = (cs->f_).m;
        target.civil_sec.f_.y._1_1_ = (cs->f_).d;
        target.civil_sec.f_.y._2_1_ = (cs->f_).hh;
        target.civil_sec.f_.y._3_1_ = (cs->f_).mm;
        target.civil_sec.f_.y._4_1_ = (cs->f_).ss;
        target.civil_sec.f_.y._5_3_ = *(undefined3 *)&(cs->f_).field_0xd;
        detail::civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::civil_time
                  ((civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> *)
                   &target.civil_sec.f_.m);
        pvVar6 = std::
                 upper_bound<absl::lts_20240722::time_internal::cctz::Transition_const*,absl::lts_20240722::time_internal::cctz::Transition,absl::lts_20240722::time_internal::cctz::Transition::ByCivilTime>
                           (pvVar4,pvVar5,&local_a8);
        std::operator&(memory_order_relaxed,__memory_order_mask);
        (this->time_local_hint_).super___atomic_base<unsigned_long>._M_i =
             ((long)pvVar6 - (long)pvVar4 >> 4) * -0x5555555555555555;
      }
    }
  }
  begin = pvVar6;
  if (begin == pvVar4) {
    bVar2 = detail::operator>=(&begin->prev_civil_sec,cs);
    if (bVar2) {
      local_b8 = std::
                 vector<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
                 ::operator[](&this->transition_types_,(ulong)this->default_transition_type_);
      bVar2 = detail::operator<(cs,&local_b8->civil_min);
      if (bVar2) {
        local_c0.__d.__r =
             (duration)
             std::chrono::
             time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
             ::min();
        anon_unknown_0::MakeUnique(__return_storage_ptr__,&local_c0);
      }
      else {
        n = (cs->f_).y;
        local_c8._0_1_ = (cs->f_).m;
        local_c8._1_1_ = (cs->f_).d;
        local_c8._2_1_ = (cs->f_).hh;
        local_c8._3_1_ = (cs->f_).mm;
        local_c8._4_1_ = (cs->f_).ss;
        local_c8._5_3_ = *(undefined3 *)&(cs->f_).field_0xd;
        local_d0 = n;
        detail::civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::civil_time
                  ((civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag> *)&shift
                  );
        a.f_._8_8_ = (long)local_b8->utc_offset;
        a.f_.y = local_e8;
        local_e0 = (fields)detail::operator+((detail *)shift,a,n);
        lhs.f_.m = (undefined1)local_c8;
        lhs.f_.d = local_c8._1_1_;
        lhs.f_.hh = local_c8._2_1_;
        lhs.f_.mm = local_c8._3_1_;
        lhs.f_.ss = local_c8._4_1_;
        lhs.f_._13_3_ = local_c8._5_3_;
        lhs.f_.y = local_d0;
        dVar7 = detail::operator-(lhs,(civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
                                       )local_e0);
        anon_unknown_0::MakeUnique(__return_storage_ptr__,dVar7);
      }
    }
    else {
      anon_unknown_0::MakeSkipped(__return_storage_ptr__,begin,cs);
    }
  }
  else if (begin == pvVar5) {
    bVar2 = detail::operator>(cs,&begin[-1].prev_civil_sec);
    if (bVar2) {
      if (((this->extended_ & 1U) == 0) ||
         (yVar8 = detail::civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::
                  year(cs), yVar8 <= this->last_year_)) {
        local_110 = std::
                    vector<absl::lts_20240722::time_internal::cctz::TransitionType,_std::allocator<absl::lts_20240722::time_internal::cctz::TransitionType>_>
                    ::operator[](&this->transition_types_,(ulong)begin[-1].type_index);
        bVar2 = detail::operator>(cs,&local_110->civil_max);
        if (bVar2) {
          local_118.__d.__r =
               (duration)
               std::chrono::
               time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1L>_>_>
               ::max();
          anon_unknown_0::MakeUnique(__return_storage_ptr__,&local_118);
        }
        else {
          lVar1 = begin[-1].unix_time;
          dVar7 = detail::operator-((civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
                                     )cs->f_,(civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
                                              )begin[-1].civil_sec.f_);
          anon_unknown_0::MakeUnique(__return_storage_ptr__,lVar1 + dVar7);
        }
      }
      else {
        yVar8 = detail::civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>::
                year(cs);
        local_f8 = ((yVar8 - this->last_year_) + -1) / 400 + 1;
        _tt_1 = (fields)anon_unknown_0::YearShift(cs,local_f8 * -400);
        TimeLocal(__return_storage_ptr__,this,(civil_second *)&tt_1,local_f8);
      }
    }
    else {
      anon_unknown_0::MakeRepeated(__return_storage_ptr__,begin + -1,cs);
    }
  }
  else {
    bVar2 = detail::operator<(&begin->prev_civil_sec,cs);
    if (bVar2) {
      anon_unknown_0::MakeSkipped(__return_storage_ptr__,begin,cs);
    }
    else {
      bVar2 = detail::operator<=(cs,&begin[-1].prev_civil_sec);
      if (bVar2) {
        anon_unknown_0::MakeRepeated(__return_storage_ptr__,begin + -1,cs);
      }
      else {
        lVar1 = begin[-1].unix_time;
        dVar7 = detail::operator-((civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
                                   )cs->f_,(civil_time<absl::lts_20240722::time_internal::cctz::detail::second_tag>
                                            )begin[-1].civil_sec.f_);
        anon_unknown_0::MakeUnique(__return_storage_ptr__,lVar1 + dVar7);
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

time_zone::civil_lookup TimeZoneInfo::MakeTime(const civil_second& cs) const {
  const std::size_t timecnt = transitions_.size();
  assert(timecnt != 0);  // We always add a transition.

  // Find the first transition after our target civil time.
  const Transition* tr = nullptr;
  const Transition* begin = &transitions_[0];
  const Transition* end = begin + timecnt;
  if (cs < begin->civil_sec) {
    tr = begin;
  } else if (cs >= transitions_[timecnt - 1].civil_sec) {
    tr = end;
  } else {
    const std::size_t hint = time_local_hint_.load(std::memory_order_relaxed);
    if (0 < hint && hint < timecnt) {
      if (transitions_[hint - 1].civil_sec <= cs) {
        if (cs < transitions_[hint].civil_sec) {
          tr = begin + hint;
        }
      }
    }
    if (tr == nullptr) {
      const Transition target = {0, 0, cs, civil_second()};
      tr = std::upper_bound(begin, end, target, Transition::ByCivilTime());
      time_local_hint_.store(static_cast<std::size_t>(tr - begin),
                             std::memory_order_relaxed);
    }
  }

  if (tr == begin) {
    if (tr->prev_civil_sec >= cs) {
      // Before first transition, so use the default offset.
      const TransitionType& tt(transition_types_[default_transition_type_]);
      if (cs < tt.civil_min) return MakeUnique(time_point<seconds>::min());
      return MakeUnique(cs - (civil_second() + tt.utc_offset));
    }
    // tr->prev_civil_sec < cs < tr->civil_sec
    return MakeSkipped(*tr, cs);
  }

  if (tr == end) {
    if (cs > (--tr)->prev_civil_sec) {
      // After the last transition. If we extended the transitions using
      // future_spec_, shift back to a supported year using the 400-year
      // cycle of calendaric equivalence and then compensate accordingly.
      if (extended_ && cs.year() > last_year_) {
        const year_t shift = (cs.year() - last_year_ - 1) / 400 + 1;
        return TimeLocal(YearShift(cs, shift * -400), shift);
      }
      const TransitionType& tt(transition_types_[tr->type_index]);
      if (cs > tt.civil_max) return MakeUnique(time_point<seconds>::max());
      return MakeUnique(tr->unix_time + (cs - tr->civil_sec));
    }
    // tr->civil_sec <= cs <= tr->prev_civil_sec
    return MakeRepeated(*tr, cs);
  }

  if (tr->prev_civil_sec < cs) {
    // tr->prev_civil_sec < cs < tr->civil_sec
    return MakeSkipped(*tr, cs);
  }

  if (cs <= (--tr)->prev_civil_sec) {
    // tr->civil_sec <= cs <= tr->prev_civil_sec
    return MakeRepeated(*tr, cs);
  }

  // In between transitions.
  return MakeUnique(tr->unix_time + (cs - tr->civil_sec));
}